

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void triangle(array<vec<3UL,_int>,_3UL> pts,vector<double,_std::allocator<double>_> *zbuffer,
             TGAImage *image,TGAColor color)

{
  double *pdVar1;
  uint uVar2;
  pointer pdVar3;
  uint uVar4;
  vec3i P;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  size_t sVar12;
  size_t sVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  double dVar22;
  vec3i A;
  vec3i B;
  TGAColor color_local;
  vec3f bc_screen;
  
  color_local.bgra = color.bgra;
  color_local.bytespp = color.bytespp;
  sVar12 = TGAImage::get_width(image);
  sVar13 = TGAImage::get_height(image);
  iVar11 = pts._M_elems[1].z;
  uVar9 = pts._M_elems[1]._0_8_;
  iVar8 = pts._M_elems[0].z;
  uVar6 = pts._M_elems[0]._0_8_;
  uVar18 = 0x80000000;
  uVar14 = 0x7fffffff;
  lVar16 = 0;
  uVar20 = 0x7fffffff;
  uVar21 = 0x80000000;
  do {
    bVar5 = true;
    while( true ) {
      lVar15 = (ulong)bVar5 * 4 + 4;
      uVar4 = uVar21;
      uVar19 = uVar20;
      if (bVar5) {
        uVar4 = uVar18;
        lVar15 = 0;
        uVar19 = uVar14;
      }
      uVar2 = *(uint *)((long)&pts._M_elems[lVar16].x + lVar15);
      iVar17 = (int)sVar13;
      if (bVar5) {
        iVar17 = (int)sVar12;
      }
      if ((int)uVar2 < (int)uVar19) {
        uVar19 = uVar2;
      }
      if ((int)uVar19 < 1) {
        uVar19 = 0;
      }
      if ((int)uVar4 < (int)uVar2) {
        uVar4 = uVar2;
      }
      if ((int)(iVar17 - 1U) <= (int)uVar4) {
        uVar4 = iVar17 - 1U;
      }
      if (!bVar5) break;
      bVar5 = false;
      uVar14 = uVar19;
      uVar18 = uVar4;
    }
    lVar16 = lVar16 + 1;
    uVar20 = uVar19;
    uVar21 = uVar4;
  } while (lVar16 != 3);
  if ((int)uVar14 <= (int)uVar18) {
    sVar12 = (size_t)uVar14;
    iVar17 = 0;
    do {
      sVar13 = (ulong)uVar19;
      if ((int)uVar19 <= (int)uVar4) {
        do {
          uVar10 = pts._M_elems[1]._0_8_;
          uVar7 = pts._M_elems[0]._0_8_;
          P.y = (int)sVar13;
          P.x = (int)sVar12;
          P.z = iVar17;
          A.z = iVar8;
          pts._M_elems[0].x = (int)uVar6;
          pts._M_elems[0].y = SUB84(uVar6,4);
          A.x = pts._M_elems[0].x;
          A.y = pts._M_elems[0].y;
          B.z = iVar11;
          pts._M_elems[1].x = (int)uVar9;
          pts._M_elems[1].y = SUB84(uVar9,4);
          B.x = pts._M_elems[1].x;
          B.y = pts._M_elems[1].y;
          pts._M_elems[0]._0_8_ = uVar7;
          pts._M_elems[1]._0_8_ = uVar10;
          barycentric(&bc_screen,A,B,pts._M_elems[2],P);
          if (((0.0 <= bc_screen.x) && (0.0 <= bc_screen.y)) && (0.0 <= bc_screen.z)) {
            lVar16 = 0;
            iVar17 = 0;
            do {
              lVar15 = (ulong)(lVar16 != 0xc) * 8 + 8;
              if (lVar16 == 0) {
                lVar15 = 0;
              }
              iVar17 = iVar17 + (int)*(double *)((long)&bc_screen.x + lVar15) *
                                *(int *)((long)&pts._M_elems[0].z + lVar16);
              lVar16 = lVar16 + 0xc;
            } while (lVar16 != 0x24);
            pdVar3 = (zbuffer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            dVar22 = (double)iVar17;
            pdVar1 = pdVar3 + sVar13 * 600 + sVar12;
            if (*pdVar1 <= dVar22 && dVar22 != *pdVar1) {
              pdVar3[sVar13 * 600 + sVar12] = dVar22;
              TGAImage::set(image,sVar12,sVar13,&color_local);
            }
          }
          sVar13 = sVar13 + 1;
        } while (uVar4 + 1 != (int)sVar13);
      }
      sVar12 = sVar12 + 1;
    } while (uVar18 + 1 != (int)sVar12);
  }
  return;
}

Assistant:

void triangle(std::array<vec3i, 3> pts, std::vector<double> &zbuffer, TGAImage &image,
              TGAColor color)
{
    vec2i bboxmin(std::numeric_limits<int>::max(), std::numeric_limits<int>::max());
    vec2i bboxmax(std::numeric_limits<int>::min(), std::numeric_limits<int>::min());
    vec2i clamp(image.get_width() - 1, image.get_height() - 1);
    for (int i = 0; i < 3; i++) {
        for (int j = 0; j < 2; j++) {
            bboxmin[j] = std::max(0, std::min(bboxmin[j], pts[i][j]));
            bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
        }
    }
    vec3i P;
    for (P.x = bboxmin.x; P.x <= bboxmax.x; P.x++) {
        for (P.y = bboxmin.y; P.y <= bboxmax.y; P.y++) {
            vec3f bc_screen = barycentric(pts[0], pts[1], pts[2], P);
            if (bc_screen.x < 0 || bc_screen.y < 0 || bc_screen.z < 0) continue;
            P.z = 0;
            for (int i = 0; i < 3; i++) P.z += pts[i][2] * static_cast<int>(bc_screen[i]);
            if (zbuffer[int(P.x + P.y * width)] < P.z) {
                zbuffer[int(P.x + P.y * width)] = P.z;
                image.set(static_cast<int>(P.x), static_cast<int>(P.y), color);
            }
        }
    }
}